

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
fmt::v9::detail::bigint::subtract_bigits(bigint *this,int index,bigit other,bigit *borrow)

{
  type tVar1;
  long lVar2;
  
  tVar1 = to_unsigned<int>(index);
  lVar2 = (ulong)(this->bigits_).super_buffer<unsigned_int>.ptr_[tVar1] -
          ((ulong)*borrow + (ulong)other);
  tVar1 = to_unsigned<int>(index);
  (this->bigits_).super_buffer<unsigned_int>.ptr_[tVar1] = (uint)lVar2;
  *borrow = (uint)((ulong)lVar2 >> 0x3f);
  return;
}

Assistant:

FMT_CONSTEXPR20 void subtract_bigits(int index, bigit other, bigit& borrow) {
    auto result = static_cast<double_bigit>((*this)[index]) - other - borrow;
    (*this)[index] = static_cast<bigit>(result);
    borrow = static_cast<bigit>(result >> (bigit_bits * 2 - 1));
  }